

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowAbove(ImGuiWindow *potential_above,ImGuiWindow *potential_below)

{
  ImGuiContext_conflict *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow *candidate_window;
  int i;
  ImGuiContext_conflict *g;
  ImGuiWindow *potential_below_local;
  ImGuiWindow *potential_above_local;
  
  pIVar1 = GImGui;
  candidate_window._4_4_ = (GImGui->Windows).Size;
  while( true ) {
    candidate_window._4_4_ = candidate_window._4_4_ + -1;
    if (candidate_window._4_4_ < 0) {
      return false;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,candidate_window._4_4_);
    if (*ppIVar2 == potential_above) break;
    if (*ppIVar2 == potential_below) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ImGui::IsWindowAbove(ImGuiWindow* potential_above, ImGuiWindow* potential_below)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* candidate_window = g.Windows[i];
        if (candidate_window == potential_above)
            return true;
        if (candidate_window == potential_below)
            return false;
    }
    return false;
}